

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O3

int __thiscall
Js::DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>
          (DictionaryPropertyDescriptor<int> *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  
  if ((this->Attributes & 0x10) == 0) {
    iVar3 = this->Data;
    if (iVar3 != -1 && (this->flags & IsAccessor) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xc1,"(!GetIsAccessor() || this->Data == NoSlots)",
                                  "!GetIsAccessor() || this->Data == NoSlots");
      if (!bVar2) {
LAB_00da4619:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      iVar3 = this->Data;
    }
  }
  else {
    if (this->Data == -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xb3,"(this->Data != NoSlots)","this->Data != NoSlots");
      if (!bVar2) goto LAB_00da4619;
      *puVar4 = 0;
    }
    iVar3 = -1;
    if ((this->flags & (IsAccessor|IsShadowed)) == IsShadowed) {
      iVar3 = this->Getter;
    }
  }
  return iVar3;
}

Assistant:

TPropertyIndex DictionaryPropertyDescriptor<TPropertyIndex>::GetDataPropertyIndex() const
    {
        // If it is let const global, the data slot is the let const property, and if we allow let const global,
        // we already return that the Getter/Setter slot may be doubled as the Data Slot
        // so only return it if we allow let const
        bool const isLetConstGlobal = (this->Attributes & PropertyLetConstGlobal) != 0;
        if (isLetConstGlobal)
        {
            Assert(this->Data != NoSlots);  // Should always have slot for LetConstGlobal if specified
            if (allowLetConstGlobal)
            {
                return this->Data;
            }
            else if (GetIsShadowed() && !GetIsAccessor())
            {
                // if it is a let const global, if the setter slot is empty, then the Getter slot must be
                // the shadowed data slot, return that.
                return this->Getter;
            }
        }
        else
        {
            Assert(!GetIsAccessor() || this->Data == NoSlots);
            return this->Data;
        }
        return NoSlots;
    }